

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O1

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,EseqExpression *eseq_expression)

{
  char cVar1;
  
  PrintTabs(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->stream_,"EseqExpression:",0xf);
  cVar1 = (char)&this->stream_;
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->stream_ + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  this->num_tabs_ = this->num_tabs_ + 1;
  (*(eseq_expression->statement_->super_BaseElement)._vptr_BaseElement[2])
            (eseq_expression->statement_,this);
  (*(eseq_expression->expression_->super_BaseElement)._vptr_BaseElement[2])
            (eseq_expression->expression_,this);
  this->num_tabs_ = this->num_tabs_ + -1;
  return;
}

Assistant:

void PrintVisitor::Visit(EseqExpression *eseq_expression) {
  PrintTabs();
  stream_ << "EseqExpression:" << std::endl;
  ++num_tabs_;
  eseq_expression->statement_->Accept(this);
  eseq_expression->expression_->Accept(this);
  --num_tabs_;

}